

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

TLVWriter * __thiscall ASDCP::MXF::TLVWriter::WriteTag(TLVWriter *this,MDDEntry *Entry)

{
  bool bVar1;
  ILogSink *pIVar2;
  long in_RDX;
  Result_t local_90 [110];
  ui8_t local_22;
  ui8_t local_21;
  long lStack_20;
  TagValue TmpTag;
  MDDEntry *Entry_local;
  TLVWriter *this_local;
  
  if (*(long *)Entry[2].ul == 0) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"No Primer object available.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    lStack_20 = in_RDX;
    (**(code **)(**(long **)Entry[2].ul + 0x18))(local_90,*(long **)Entry[2].ul,in_RDX,&local_22);
    bVar1 = Kumu::Result_t::operator!=(local_90,(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::~Result_t(local_90);
    if (bVar1) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"No tag for entry %s\n",*(undefined8 *)(lStack_20 + 0x18));
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      bVar1 = Kumu::MemIOWriter::WriteUi8((MemIOWriter *)Entry,local_22);
      if (bVar1) {
        bVar1 = Kumu::MemIOWriter::WriteUi8((MemIOWriter *)Entry,local_21);
        if (bVar1) {
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
        }
        else {
          Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        }
      }
      else {
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteTag(const MDDEntry& Entry)
{
  if ( m_Lookup == 0 )
    {
      DefaultLogSink().Error("No Primer object available.\n");
      return RESULT_FAIL;
    }

  TagValue TmpTag;

  if ( m_Lookup->InsertTag(Entry, TmpTag) != RESULT_OK )
    {
      DefaultLogSink().Error("No tag for entry %s\n", Entry.name);
      return RESULT_FAIL;
    }

  if ( ! MemIOWriter::WriteUi8(TmpTag.a) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  if ( ! MemIOWriter::WriteUi8(TmpTag.b) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  return RESULT_OK;
}